

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O0

void remove_tracked_handle
               (IOTHUBTRANSPORT_AMQP_METHODS *amqp_methods_handle,
               IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)

{
  undefined1 auVar1 [16];
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *ppIVar2;
  LOGGER_LOG p_Var3;
  size_t local_48;
  size_t local_40;
  LOGGER_LOG l;
  size_t realloc_size;
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *new_handles;
  size_t i;
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle_local;
  IOTHUBTRANSPORT_AMQP_METHODS *amqp_methods_handle_local;
  
  for (new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0;
      new_handles <
      (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)amqp_methods_handle->method_request_handle_count;
      new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)((long)new_handles + 1)) {
    if (amqp_methods_handle->method_request_handles[(long)new_handles] == method_request_handle) {
      if (1 < amqp_methods_handle->method_request_handle_count - (long)new_handles) {
        memmove(amqp_methods_handle->method_request_handles + (long)new_handles,
                amqp_methods_handle->method_request_handles + (long)new_handles + 1,
                ((amqp_methods_handle->method_request_handle_count - (long)new_handles) + -1) * 8);
      }
      amqp_methods_handle->method_request_handle_count =
           amqp_methods_handle->method_request_handle_count - 1;
      new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)((long)new_handles + -1);
    }
  }
  if (amqp_methods_handle->method_request_handle_count == 0) {
    free(amqp_methods_handle->method_request_handles);
    amqp_methods_handle->method_request_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0;
  }
  else {
    if (amqp_methods_handle->method_request_handle_count == 0) {
      local_40 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = amqp_methods_handle->method_request_handle_count;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
        local_48 = 0xffffffffffffffff;
      }
      else {
        local_48 = amqp_methods_handle->method_request_handle_count << 3;
      }
      local_40 = local_48;
    }
    if ((local_40 == 0xffffffffffffffff) ||
       (ppIVar2 = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)
                  realloc(amqp_methods_handle->method_request_handles,local_40),
       ppIVar2 == (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                  ,"remove_tracked_handle",0x61,1,"realloc error, size:%zu",local_40);
      }
    }
    else {
      amqp_methods_handle->method_request_handles = ppIVar2;
    }
  }
  return;
}

Assistant:

static void remove_tracked_handle(IOTHUBTRANSPORT_AMQP_METHODS* amqp_methods_handle, IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)
{
    size_t i;

    for (i = 0; i < amqp_methods_handle->method_request_handle_count; i++)
    {
        if (amqp_methods_handle->method_request_handles[i] == method_request_handle)
        {
            if (amqp_methods_handle->method_request_handle_count - i > 1)
            {
                (void)memmove(&amqp_methods_handle->method_request_handles[i], &amqp_methods_handle->method_request_handles[i + 1],
                    (amqp_methods_handle->method_request_handle_count - i - 1) * sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
            }

            amqp_methods_handle->method_request_handle_count--;
            i--;
        }
    }

    if (amqp_methods_handle->method_request_handle_count == 0)
    {
        free(amqp_methods_handle->method_request_handles);
        amqp_methods_handle->method_request_handles = NULL;
    }
    else
    {
        IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
        size_t realloc_size = safe_multiply_size_t(amqp_methods_handle->method_request_handle_count, sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
        if (realloc_size != SIZE_MAX && (
            new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) != NULL)
        {
            amqp_methods_handle->method_request_handles = new_handles;
        }
        else
        {
            LogError("realloc error, size:%zu", realloc_size);
        }
    }
}